

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

positionTy * __thiscall positionTy::WorldToLocal(positionTy *this)

{
  undefined1 *puVar1;
  
  if (((this->f).field_0x1 & 4) == 0) {
    XPLMWorldToLocal(this->_lat,this->_lon,this->_alt,&this->_lon,&this->_alt,this);
    puVar1 = &(this->f).field_0x1;
    *puVar1 = *puVar1 | 4;
  }
  return this;
}

Assistant:

positionTy& positionTy::WorldToLocal()
{
    if (f.unitCoord == UNIT_WORLD) {
        XPLMWorldToLocal(lat(), lon(), alt_m(),
                         &X(), &Y(), &Z());
        f.unitCoord = UNIT_LOCAL;
    }
    return *this;
}